

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  long lVar4;
  byte bVar5;
  uint32_t uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  uint8_t uVar28;
  ushort uVar29;
  uint8_t *puVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  uint32_t uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_f0;
  size_t *local_d8;
  ulong local_b8;
  size_t cur_ix_masked;
  
  local_140 = *(ulong *)dist_cache;
  uVar2 = position + num_bytes;
  uVar14 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar14 = position;
  }
  lVar37 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar37 = 0x40;
  }
  if (uVar2 <= position + 8) {
    local_d8 = last_insert_len;
LAB_0011ec53:
    *(ulong *)dist_cache = (local_140 + uVar2) - position;
    *(long *)commands = *(long *)commands + ((long)local_d8 - (long)last_insert_len >> 4);
    return;
  }
  uVar38 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar7 = *(long *)(literal_context_lut + 0x10);
  local_b8 = lVar37 + position;
  lVar8 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar11 = (uint)ringbuffer_mask;
  uVar1 = uVar2 - 7;
  lVar4 = position - 1;
  local_d8 = last_insert_len;
  local_138 = position;
LAB_0011dd8d:
  uVar35 = uVar2 - local_138;
  uVar16 = uVar38;
  if (local_138 < uVar38) {
    uVar16 = local_138;
  }
  uVar39 = local_138 & ringbuffer_mask;
  puVar3 = ringbuffer + uVar39;
  uVar28 = ringbuffer[uVar39];
  local_108 = (ulong)*(int *)&(hasher->common).extra;
  local_130 = 0x7e4;
  if (local_138 - local_108 < local_138) {
    uVar21 = (ulong)((uint)(local_138 - local_108) & uVar11);
    if (uVar28 == ringbuffer[uVar21]) {
      if (7 < uVar35) {
        uVar15 = uVar35 & 0xfffffffffffffff8;
        puVar30 = ringbuffer + uVar15 + uVar39;
        lVar32 = 0;
        uVar26 = 0;
LAB_0011de18:
        if (*(ulong *)(puVar3 + uVar26 * 8) == *(ulong *)(ringbuffer + uVar26 * 8 + uVar21))
        goto code_r0x0011de2a;
        uVar15 = *(ulong *)(ringbuffer + uVar26 * 8 + uVar21) ^ *(ulong *)(puVar3 + uVar26 * 8);
        uVar21 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        local_f0 = (uVar21 >> 3 & 0x1fffffff) - lVar32;
        goto LAB_0011de80;
      }
      uVar15 = 0;
      puVar30 = puVar3;
LAB_0011ec18:
      uVar26 = uVar35 & 7;
      local_f0 = uVar15;
      if (uVar26 != 0) {
        uVar33 = uVar15 | uVar26;
        do {
          local_f0 = uVar15;
          if (ringbuffer[uVar15 + uVar21] != *puVar30) break;
          puVar30 = puVar30 + 1;
          uVar15 = uVar15 + 1;
          uVar26 = uVar26 - 1;
          local_f0 = uVar33;
        } while (uVar26 != 0);
      }
LAB_0011de80:
      if ((3 < local_f0) && (uVar21 = local_f0 * 0x87 + 0x78f, 0x7e4 < uVar21)) {
        uVar28 = puVar3[local_f0];
        local_130 = uVar21;
        goto LAB_0011deb6;
      }
    }
    local_108 = 0;
    local_f0 = 0;
  }
  else {
    local_108 = 0;
    local_f0 = 0;
  }
LAB_0011deb6:
  lVar32 = *(long *)(ringbuffer + uVar39);
  lVar27 = 0;
  do {
    *(ulong *)((long)&cur_ix_masked + lVar27) =
         (ulong)((uint)((ulong)(lVar32 * 0x35a7bd1e35a7bd00) >> 0x2c) + (int)lVar27 & 0xfffff);
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x20);
  uVar19 = (uint)local_138;
  uVar15 = (ulong)((uint)uVar35 & 7);
  uVar21 = uVar35 & 0xfffffffffffffff8;
  lVar32 = 0;
  do {
    uVar20 = *(uint *)(lVar8 + (&cur_ix_masked)[lVar32] * 4);
    uVar18 = uVar11 & uVar20;
    if (((uVar28 == ringbuffer[local_f0 + uVar18]) && (local_138 != uVar20)) &&
       (uVar26 = local_138 - uVar20, uVar26 <= uVar16)) {
      if (7 < uVar35) {
        lVar27 = 0;
        uVar33 = 0;
LAB_0011df6d:
        if (*(ulong *)(puVar3 + uVar33 * 8) == *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)uVar18))
        goto code_r0x0011df7f;
        uVar36 = *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)uVar18) ^
                 *(ulong *)(puVar3 + uVar33 * 8);
        uVar33 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = (uVar33 >> 3 & 0x1fffffff) - lVar27;
        goto LAB_0011dfbd;
      }
      puVar30 = puVar3;
      uVar36 = 0;
LAB_0011e019:
      uVar33 = uVar36;
      if (uVar15 != 0) {
        uVar23 = uVar15 | uVar36;
        uVar24 = uVar15;
        do {
          uVar33 = uVar36;
          if (ringbuffer[uVar36 + uVar18] != *puVar30) break;
          puVar30 = puVar30 + 1;
          uVar36 = uVar36 + 1;
          uVar24 = uVar24 - 1;
          uVar33 = uVar23;
        } while (uVar24 != 0);
      }
LAB_0011dfbd:
      if (3 < uVar33) {
        iVar25 = 0x1f;
        if ((uint)uVar26 != 0) {
          for (; (uint)uVar26 >> iVar25 == 0; iVar25 = iVar25 + -1) {
          }
        }
        uVar36 = (ulong)(iVar25 * -0x1e + 0x780) + uVar33 * 0x87;
        if (local_130 < uVar36) {
          uVar28 = puVar3[uVar33];
          local_f0 = uVar33;
          local_130 = uVar36;
          local_108 = uVar26;
        }
      }
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 4);
  *(uint *)(lVar8 + *(long *)((long)&cur_ix_masked + (ulong)(uVar19 & 0x18)) * 4) = uVar19;
  if (0x1f < uVar35 && (local_138 & 3) == 0) {
    uVar15 = (params->dist).max_distance;
    if (uVar15 <= local_138) {
      uVar34 = (params->dist).distance_postfix_bits;
      iVar25 = *(int *)((long)&(params->dictionary).words + 4);
      uVar6 = (params->dictionary).num_transforms;
      uVar26 = (ulong)((uint)uVar35 & 7);
      do {
        uVar20 = uVar34 & 0x3fffffff;
        bVar17 = ringbuffer[uVar15 & ringbuffer_mask];
        bVar5 = ringbuffer[uVar15 + 0x20 & ringbuffer_mask];
        if (uVar20 < 0x1000000) {
          lVar32 = *(long *)&(params->dist).alphabet_size_max;
          uVar18 = *(uint *)(lVar32 + (ulong)uVar20 * 4);
          *(int *)(lVar32 + (ulong)uVar20 * 4) = (int)uVar15;
          if ((uVar15 == local_138) && (uVar18 != 0xffffffff)) {
            uVar20 = uVar19 - uVar18;
            if (uVar20 <= uVar16) {
              if (7 < uVar35) {
                lVar32 = 0;
                uVar33 = 0;
LAB_0011e151:
                if (*(ulong *)(puVar3 + uVar33 * 8) ==
                    *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)(uVar18 & uVar11)))
                goto code_r0x0011e163;
                uVar36 = *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)(uVar18 & uVar11)) ^
                         *(ulong *)(puVar3 + uVar33 * 8);
                uVar33 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar33 = (uVar33 >> 3 & 0x1fffffff) - lVar32;
                goto LAB_0011e194;
              }
              uVar36 = 0;
              puVar30 = puVar3;
LAB_0011e1eb:
              uVar33 = uVar36;
              if (uVar26 != 0) {
                uVar23 = uVar26 | uVar36;
                uVar24 = uVar26;
                do {
                  uVar33 = uVar36;
                  if (ringbuffer[uVar36 + (uVar18 & uVar11)] != *puVar30) break;
                  puVar30 = puVar30 + 1;
                  uVar36 = uVar36 + 1;
                  uVar24 = uVar24 - 1;
                  uVar33 = uVar23;
                } while (uVar24 != 0);
              }
LAB_0011e194:
              if ((3 < uVar33) && (local_f0 < uVar33)) {
                iVar13 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                uVar36 = (ulong)(iVar13 * -0x1e + 0x780) + uVar33 * 0x87;
                if (local_130 < uVar36) {
                  local_130 = uVar36;
                  local_108 = (ulong)uVar20;
                  local_f0 = uVar33;
                }
              }
            }
          }
        }
        uVar34 = ~(uint)bVar17 * uVar6 + (uint)bVar5 + uVar34 * iVar25 + 1;
        uVar15 = uVar15 + 4;
      } while (uVar15 <= local_138);
      (params->dist).distance_postfix_bits = uVar34;
    }
    (params->dist).max_distance = local_138 + 4;
  }
  if (0x7e4 < local_130) {
    uVar16 = (ulong)*(int *)&(hasher->common).extra;
    uVar39 = (lVar4 + num_bytes) - local_138;
    iVar25 = 0;
LAB_0011e26b:
    uVar21 = local_138;
    uVar26 = uVar39 >> 3;
    uVar35 = uVar35 - 1;
    uVar15 = local_f0 - 1;
    if (uVar35 <= local_f0 - 1) {
      uVar15 = uVar35;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar15 = 0;
    }
    uVar33 = local_138 + 1;
    uVar36 = uVar38;
    if (uVar33 < uVar38) {
      uVar36 = uVar33;
    }
    puVar3 = ringbuffer + (uVar33 & ringbuffer_mask);
    uVar28 = puVar3[uVar15];
    uVar24 = uVar33 - uVar16;
    local_118 = 0x7e4;
    if ((uVar24 < uVar33) && (uVar19 = (uint)uVar24 & uVar11, uVar28 == ringbuffer[uVar15 + uVar19])
       ) {
      if (7 < uVar35) {
        lVar32 = 0;
        uVar24 = 0;
LAB_0011e302:
        if (*(ulong *)(puVar3 + uVar24 * 8) == *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar19))
        goto code_r0x0011e30f;
        uVar23 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar19) ^
                 *(ulong *)(puVar3 + uVar24 * 8);
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        local_120 = (uVar24 >> 3 & 0x1fffffff) - lVar32;
        goto LAB_0011e33b;
      }
      local_120 = 0;
      puVar30 = puVar3;
      goto LAB_0011e746;
    }
    goto LAB_0011e379;
  }
  local_140 = local_140 + 1;
  position = local_138 + 1;
  if ((num_literals == (size_t *)0x0) && (local_b8 < position)) {
    if ((uint)((int)lVar37 * 4) + local_b8 < position) {
      uVar16 = local_138 + 0x11;
      if (uVar1 <= local_138 + 0x11) {
        uVar16 = uVar1;
      }
      for (; position < uVar16; position = position + 4) {
        *(uint *)(lVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_140 = local_140 + 4;
      }
    }
    else {
      uVar16 = local_138 + 9;
      if (uVar1 <= local_138 + 9) {
        uVar16 = uVar1;
      }
      for (; position < uVar16; position = position + 2) {
        *(uint *)(lVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_140 = local_140 + 2;
      }
    }
  }
  goto LAB_0011ebd8;
code_r0x0011de2a:
  uVar26 = uVar26 + 1;
  lVar32 = lVar32 + -8;
  if (uVar35 >> 3 == uVar26) goto LAB_0011ec18;
  goto LAB_0011de18;
code_r0x0011df7f:
  uVar33 = uVar33 + 1;
  lVar27 = lVar27 + -8;
  puVar30 = ringbuffer + uVar21 + uVar39;
  uVar36 = uVar21;
  if (uVar35 >> 3 == uVar33) goto LAB_0011e019;
  goto LAB_0011df6d;
code_r0x0011e163:
  uVar33 = uVar33 + 1;
  lVar32 = lVar32 + -8;
  uVar36 = uVar21;
  puVar30 = ringbuffer + uVar21 + uVar39;
  if (uVar35 >> 3 == uVar33) goto LAB_0011e1eb;
  goto LAB_0011e151;
code_r0x0011e30f:
  uVar24 = uVar24 + 1;
  lVar32 = lVar32 + -8;
  if (uVar26 == uVar24) goto code_r0x0011e31d;
  goto LAB_0011e302;
code_r0x0011e31d:
  local_120 = -lVar32;
  puVar30 = puVar3 + -lVar32;
LAB_0011e746:
  uVar24 = uVar35 & 7;
  for (; (uVar24 != 0 && (ringbuffer[local_120 + uVar19] == *puVar30)); local_120 = local_120 + 1) {
    puVar30 = puVar30 + 1;
    uVar24 = uVar24 - 1;
  }
LAB_0011e33b:
  if (local_120 < 4) {
    local_128 = 0;
    local_120 = 0;
  }
  else {
    uVar24 = local_120 * 0x87 + 0x78f;
    if (uVar24 < 0x7e5) {
LAB_0011e379:
      local_128 = 0;
      local_120 = 0;
    }
    else {
      uVar28 = puVar3[local_120];
      uVar15 = local_120;
      local_128 = uVar16;
      local_118 = uVar24;
    }
  }
  lVar32 = *(long *)(ringbuffer + (uVar33 & ringbuffer_mask));
  lVar27 = 0;
  do {
    *(ulong *)((long)&cur_ix_masked + lVar27) =
         (ulong)((uint)((ulong)(lVar32 * 0x35a7bd1e35a7bd00) >> 0x2c) + (int)lVar27 & 0xfffff);
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x20);
  uVar19 = (uint)uVar33;
  uVar24 = (ulong)((uint)uVar35 & 7);
  lVar32 = 0;
LAB_0011e3da:
  uVar20 = *(uint *)(lVar8 + (&cur_ix_masked)[lVar32] * 4);
  uVar18 = uVar11 & uVar20;
  if (((uVar28 == ringbuffer[uVar15 + uVar18]) && (uVar33 != uVar20)) &&
     (uVar23 = uVar33 - uVar20, uVar23 <= uVar36)) {
    uVar22 = uVar24;
    if (7 < uVar35) {
      lVar27 = 0;
      uVar31 = 0;
LAB_0011e421:
      if (*(ulong *)(puVar3 + uVar31 * 8) == *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar18))
      goto code_r0x0011e42e;
      uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar18) ^ *(ulong *)(puVar3 + uVar31 * 8)
      ;
      uVar22 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar31 = (uVar22 >> 3 & 0x1fffffff) - lVar27;
      goto LAB_0011e458;
    }
    uVar31 = 0;
    puVar30 = puVar3;
    goto joined_r0x0011e4d0;
  }
  goto LAB_0011e4b3;
code_r0x0011e42e:
  uVar31 = uVar31 + 1;
  lVar27 = lVar27 + -8;
  if (uVar26 == uVar31) goto code_r0x0011e43c;
  goto LAB_0011e421;
code_r0x0011e43c:
  uVar31 = -lVar27;
  puVar30 = puVar3 + -lVar27;
joined_r0x0011e4d0:
  for (; (uVar22 != 0 && (ringbuffer[uVar31 + uVar18] == *puVar30)); uVar31 = uVar31 + 1) {
    puVar30 = puVar30 + 1;
    uVar22 = uVar22 - 1;
  }
LAB_0011e458:
  if (3 < uVar31) {
    iVar13 = 0x1f;
    if ((uint)uVar23 != 0) {
      for (; (uint)uVar23 >> iVar13 == 0; iVar13 = iVar13 + -1) {
      }
    }
    uVar22 = (ulong)(iVar13 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_118 < uVar22) {
      uVar28 = puVar3[uVar31];
      uVar15 = uVar31;
      local_128 = uVar23;
      local_120 = uVar31;
      local_118 = uVar22;
    }
  }
LAB_0011e4b3:
  lVar32 = lVar32 + 1;
  if (lVar32 == 4) goto LAB_0011e4ef;
  goto LAB_0011e3da;
LAB_0011e4ef:
  *(uint *)(lVar8 + *(long *)((long)&cur_ix_masked + (ulong)(uVar19 & 0x18)) * 4) = uVar19;
  if (uVar35 < 0x20 || (uVar33 & 3) != 0) goto LAB_0011e6cd;
  uVar15 = (params->dist).max_distance;
  if (uVar15 <= uVar33) {
    uVar34 = (params->dist).distance_postfix_bits;
    iVar13 = *(int *)((long)&(params->dictionary).words + 4);
    uVar6 = (params->dictionary).num_transforms;
LAB_0011e566:
    uVar20 = uVar34 & 0x3fffffff;
    bVar17 = ringbuffer[uVar15 & ringbuffer_mask];
    bVar5 = ringbuffer[uVar15 + 0x20 & ringbuffer_mask];
    if (uVar20 < 0x1000000) {
      lVar32 = *(long *)&(params->dist).alphabet_size_max;
      uVar18 = *(uint *)(lVar32 + (ulong)uVar20 * 4);
      *(int *)(lVar32 + (ulong)uVar20 * 4) = (int)uVar15;
      if ((uVar15 == uVar33) && (uVar18 != 0xffffffff)) {
        uVar20 = uVar19 - uVar18;
        if (uVar20 <= uVar36) {
          lVar32 = 0;
          uVar24 = 0;
LAB_0011e5ee:
          if (*(ulong *)(puVar3 + uVar24 * 8) ==
              *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)(uVar18 & uVar11))) goto code_r0x0011e5fb;
          uVar23 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)(uVar18 & uVar11)) ^
                   *(ulong *)(puVar3 + uVar24 * 8);
          uVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar32;
          goto LAB_0011e647;
        }
      }
    }
    goto LAB_0011e5b7;
  }
  goto LAB_0011e6ac;
code_r0x0011e5fb:
  uVar24 = uVar24 + 1;
  lVar32 = lVar32 + -8;
  if (uVar26 == uVar24) goto code_r0x0011e609;
  goto LAB_0011e5ee;
code_r0x0011e609:
  uVar23 = (ulong)((uint)uVar35 & 7);
  for (uVar24 = -lVar32; (uVar23 != 0 && (ringbuffer[uVar24 + (uVar18 & uVar11)] == puVar3[uVar24]))
      ; uVar24 = uVar24 + 1) {
    uVar23 = uVar23 - 1;
  }
LAB_0011e647:
  if ((3 < uVar24) && (local_120 < uVar24)) {
    iVar10 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar23 = (ulong)(iVar10 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_118 < uVar23) {
      local_128 = (ulong)uVar20;
      local_120 = uVar24;
      local_118 = uVar23;
    }
  }
LAB_0011e5b7:
  uVar34 = (uint)bVar5 + uVar34 * iVar13 + ~(uint)bVar17 * uVar6 + 1;
  uVar15 = uVar15 + 4;
  if (uVar33 < uVar15) goto LAB_0011e697;
  goto LAB_0011e566;
LAB_0011e697:
  (params->dist).distance_postfix_bits = uVar34;
LAB_0011e6ac:
  (params->dist).max_distance = local_138 + 5;
LAB_0011e6cd:
  bVar40 = local_130 + 0xaf <= local_118;
  iVar13 = iVar25;
  if (bVar40) {
    local_140 = local_140 + 1;
    local_108 = local_128;
    local_f0 = local_120;
    local_130 = local_118;
    local_138 = uVar33;
    iVar13 = iVar25 + 1;
  }
  bVar9 = 2 < iVar25;
  uVar39 = uVar39 - 1;
  iVar25 = iVar13;
  if (!bVar40 || (bVar9 || uVar2 <= uVar21 + 9)) goto LAB_0011e818;
  goto LAB_0011e26b;
LAB_0011e818:
  uVar16 = local_138 + lVar7;
  if (uVar38 <= local_138 + lVar7) {
    uVar16 = uVar38;
  }
  if (local_108 <= uVar16) {
    uVar35 = (ulong)*(int *)&(hasher->common).extra;
    uVar19 = 0;
    bVar40 = false;
    if (local_108 != uVar35) {
      uVar39 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      if (local_108 == uVar39) {
        uVar19 = 1;
      }
      else {
        uVar35 = (local_108 + 3) - uVar35;
        if (uVar35 < 7) {
          bVar17 = (byte)((int)uVar35 << 2);
          uVar19 = 0x9750468;
        }
        else {
          uVar39 = (local_108 + 3) - uVar39;
          if (6 < uVar39) {
            if (local_108 != (long)(int)(hasher->common).dict_num_lookups) {
              bVar40 = local_108 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar19 = 3;
              goto LAB_0011e92a;
            }
            uVar19 = 2;
            goto LAB_0011e928;
          }
          bVar17 = (byte)((int)uVar39 << 2);
          uVar19 = 0xfdb1ace;
        }
        uVar19 = uVar19 >> (bVar17 & 0x1f) & 0xf;
      }
LAB_0011e928:
      bVar40 = false;
    }
LAB_0011e92a:
    if (!bVar40) {
      uVar35 = (ulong)uVar19;
      goto LAB_0011e937;
    }
  }
  uVar35 = local_108 + 0xf;
LAB_0011e937:
  if ((local_108 <= uVar16) && (uVar35 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_108;
  }
  uVar19 = (uint)local_140;
  *(uint *)local_d8 = uVar19;
  uVar20 = (uint)local_f0;
  *(uint *)((long)local_d8 + 4) = uVar20;
  uVar16 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  if (uVar35 < uVar16) {
    *(short *)((long)local_d8 + 0xe) = (short)uVar35;
    uVar18 = 0;
  }
  else {
    bVar17 = (byte)*(int *)(literal_context_lut + 0x40);
    uVar35 = ((uVar35 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar17 & 0x3f))) - 0x10;
    uVar18 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) + 0x1f;
    bVar40 = (uVar35 >> ((ulong)uVar18 & 0x3f) & 1) != 0;
    iVar25 = uVar18 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)local_d8 + 0xe) =
         (short)((uint)bVar40 + iVar25 * 2 + 0xfffe << (bVar17 & 0x3f)) +
         (short)uVar16 + (~(ushort)(-1 << (bVar17 & 0x1f)) & (ushort)uVar35) | (short)iVar25 * 0x400
    ;
    uVar18 = (uint)(uVar35 - ((ulong)bVar40 + 2 << ((byte)uVar18 & 0x3f)) >> (bVar17 & 0x3f));
  }
  *(uint *)(local_d8 + 1) = uVar18;
  if (5 < local_140) {
    if (local_140 < 0x82) {
      uVar19 = 0x1f;
      uVar18 = (uint)(local_140 - 2);
      if (uVar18 != 0) {
        for (; uVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar19 = (int)(local_140 - 2 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar19 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_140 < 0x842) {
      uVar18 = 0x1f;
      if (uVar19 - 0x42 != 0) {
        for (; uVar19 - 0x42 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar19 = (uVar18 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar19 = 0x15;
      if (0x1841 < local_140) {
        uVar19 = (uint)(ushort)(0x17 - (local_140 < 0x5842));
      }
    }
  }
  uVar16 = (ulong)(int)uVar20;
  if (uVar16 < 10) {
    uVar18 = uVar20 - 2;
  }
  else if (uVar16 < 0x86) {
    uVar20 = 0x1f;
    uVar18 = (uint)(uVar16 - 6);
    if (uVar18 != 0) {
      for (; uVar18 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    uVar18 = (int)(uVar16 - 6 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar20 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar18 = 0x17;
    if (uVar16 < 0x846) {
      uVar18 = 0x1f;
      if (uVar20 - 0x46 != 0) {
        for (; uVar20 - 0x46 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (uVar18 ^ 0xffe0) + 0x2c;
    }
  }
  uVar12 = (ushort)uVar18;
  uVar29 = (uVar12 & 7) + ((ushort)uVar19 & 7) * 8;
  if ((((*(ushort *)((long)local_d8 + 0xe) & 0x3ff) == 0) && ((ushort)uVar19 < 8)) &&
     (uVar12 < 0x10)) {
    if (7 < uVar12) {
      uVar29 = uVar29 | 0x40;
    }
  }
  else {
    iVar25 = ((uVar19 & 0xffff) >> 3) * 3 + ((uVar18 & 0xffff) >> 3);
    uVar29 = uVar29 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar25 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_d8 + 0xc) = uVar29;
  *num_commands = *num_commands + local_140;
  position = local_138 + local_f0;
  uVar16 = uVar14;
  if (position < uVar14) {
    uVar16 = position;
  }
  uVar35 = local_138 + 2;
  if (local_108 < local_f0 >> 2) {
    uVar39 = position + local_108 * -4;
    if (uVar39 < uVar35) {
      uVar39 = uVar35;
    }
    uVar35 = uVar39;
    if (uVar16 < uVar39) {
      uVar35 = uVar16;
    }
  }
  local_b8 = lVar37 + local_f0 * 2 + local_138;
  local_d8 = local_d8 + 2;
  if (uVar35 < uVar16) {
    do {
      *(uint *)(lVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar35 & ringbuffer_mask)) *
                                              0x35a7bd1e35a7bd00) >> 0x2c) + ((uint)uVar35 & 0x18) &
                               0xfffff) * 4) = (uint)uVar35;
      uVar35 = uVar35 + 1;
    } while (uVar16 != uVar35);
  }
  local_140 = 0;
LAB_0011ebd8:
  local_138 = position;
  if (uVar2 <= position + 8) goto LAB_0011ec53;
  goto LAB_0011dd8d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}